

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyramid.c
# Opt level: O0

int fill_pyramid(YV12_BUFFER_CONFIG *frame,int bit_depth,int n_levels,ImagePyramid *frame_pyr)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  _Bool _Var6;
  int iVar7;
  undefined8 *puVar8;
  uint8_t *img_buf;
  long in_RCX;
  int in_EDX;
  char in_SIL;
  long in_RDI;
  int input_layer_height;
  int input_layer_width;
  int this_stride;
  int this_height;
  int this_width;
  uint8_t *this_buffer;
  PyramidLayer *this_layer;
  int prev_stride;
  uint8_t *prev_buffer;
  PyramidLayer *prev_layer;
  _Bool mem_status;
  int level;
  int x;
  uint8_t *pyr_row;
  uint16_t *frame_row;
  int y;
  int pyr_stride;
  uint8_t *pyr_buffer;
  uint16_t *frame_buffer;
  PyramidLayer *first_layer;
  int frame_stride;
  int frame_height;
  int frame_width;
  int already_filled_levels;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  int in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  int iVar9;
  int in_stack_ffffffffffffff64;
  int iVar10;
  undefined8 in_stack_ffffffffffffff68;
  uint8_t *input;
  uint8_t *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff78;
  int iVar11;
  uint8_t *input_00;
  int in_stack_ffffffffffffff90;
  _Bool local_69;
  int local_64;
  int local_50;
  int local_24;
  
  local_24 = *(int *)(in_RCX + 0x2c);
  if (local_24 < in_EDX) {
    iVar11 = *(int *)(in_RDI + 0x10);
    iVar9 = *(int *)(in_RDI + 0x18);
    iVar10 = *(int *)(in_RDI + 0x20);
    if (local_24 == 0) {
      plVar1 = *(long **)(in_RCX + 0x38);
      if ((*(uint *)(in_RDI + 0xc0) & 8) == 0) {
        *plVar1 = *(long *)(in_RDI + 0x28);
        *(int *)(plVar1 + 1) = iVar11;
        *(int *)((long)plVar1 + 0xc) = iVar9;
        *(int *)(plVar1 + 2) = iVar10;
      }
      else {
        lVar2 = *(long *)(in_RDI + 0x28);
        lVar3 = *plVar1;
        lVar4 = plVar1[2];
        for (local_50 = 0; local_50 < iVar9; local_50 = local_50 + 1) {
          for (local_64 = 0; local_64 < iVar11; local_64 = local_64 + 1) {
            *(char *)(lVar3 + local_50 * (int)lVar4 + (long)local_64) =
                 (char)((int)(uint)*(ushort *)
                                    (lVar2 * 2 + (long)(local_50 * iVar10) * 2 + (long)local_64 * 2)
                       >> (in_SIL - 8U & 0x1f));
          }
        }
        fill_border(in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                    (int)in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
      }
      local_24 = 1;
    }
    for (; local_24 < in_EDX; local_24 = local_24 + 1) {
      puVar8 = (undefined8 *)(*(long *)(in_RCX + 0x38) + (long)(local_24 + -1) * 0x18);
      input_00 = (uint8_t *)*puVar8;
      iVar11 = *(int *)(puVar8 + 2);
      img_buf = (uint8_t *)(*(long *)(in_RCX + 0x38) + (long)local_24 * 0x18);
      input = *(uint8_t **)img_buf;
      iVar9 = *(int *)(img_buf + 0xc);
      iVar7 = iVar9 << 1;
      iVar10 = *(int *)(img_buf + 0x10);
      iVar5 = *(int *)(img_buf + 8);
      _Var6 = should_resize_by_half
                        (in_stack_ffffffffffffff44,in_stack_ffffffffffffff40,
                         in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
      in_stack_ffffffffffffff38 = iVar5;
      in_stack_ffffffffffffff40 = iVar10;
      iVar10 = in_stack_ffffffffffffff38;
      if (_Var6) {
        local_69 = av1_resize_plane_to_half
                             (input,in_stack_ffffffffffffff38,iVar9,in_stack_ffffffffffffff40,
                              (uint8_t *)CONCAT44(iVar7,in_stack_ffffffffffffff50),
                              in_stack_ffffffffffffff4c,(int)input_00,(int)puVar8);
      }
      else {
        local_69 = av1_resize_plane(input_00,iVar11,in_stack_ffffffffffffff78,
                                    (int)((ulong)img_buf >> 0x20),input,in_stack_ffffffffffffff38,
                                    in_stack_ffffffffffffff90,local_24);
      }
      if (local_69 == false) {
        *(int *)(in_RCX + 0x2c) = in_EDX;
        return -1;
      }
      fill_border(img_buf,(int)((ulong)input >> 0x20),(int)input,iVar10);
    }
    *(int *)(in_RCX + 0x2c) = in_EDX;
  }
  return in_EDX;
}

Assistant:

static inline int fill_pyramid(const YV12_BUFFER_CONFIG *frame, int bit_depth,
                               int n_levels, ImagePyramid *frame_pyr) {
  int already_filled_levels = frame_pyr->filled_levels;

  // This condition should already be enforced by aom_compute_pyramid
  assert(n_levels <= frame_pyr->max_levels);

  if (already_filled_levels >= n_levels) {
    return n_levels;
  }

  const int frame_width = frame->y_crop_width;
  const int frame_height = frame->y_crop_height;
  const int frame_stride = frame->y_stride;
  assert((frame_width >> n_levels) >= 0);
  assert((frame_height >> n_levels) >= 0);

  if (already_filled_levels == 0) {
    // Fill in largest level from the original image
    PyramidLayer *first_layer = &frame_pyr->layers[0];
    if (frame->flags & YV12_FLAG_HIGHBITDEPTH) {
      // For frames stored in a 16-bit buffer, we need to downconvert to 8 bits
      assert(first_layer->width == frame_width);
      assert(first_layer->height == frame_height);

      uint16_t *frame_buffer = CONVERT_TO_SHORTPTR(frame->y_buffer);
      uint8_t *pyr_buffer = first_layer->buffer;
      int pyr_stride = first_layer->stride;
      for (int y = 0; y < frame_height; y++) {
        uint16_t *frame_row = frame_buffer + y * frame_stride;
        uint8_t *pyr_row = pyr_buffer + y * pyr_stride;
        for (int x = 0; x < frame_width; x++) {
          pyr_row[x] = frame_row[x] >> (bit_depth - 8);
        }
      }

      fill_border(pyr_buffer, frame_width, frame_height, pyr_stride);
    } else {
      // For frames stored in an 8-bit buffer, we don't need to copy anything -
      // we can just reference the original image buffer
      first_layer->buffer = frame->y_buffer;
      first_layer->width = frame_width;
      first_layer->height = frame_height;
      first_layer->stride = frame_stride;
    }

    already_filled_levels = 1;
  }

  // Fill in the remaining levels through progressive downsampling
  for (int level = already_filled_levels; level < n_levels; ++level) {
    bool mem_status = false;
    PyramidLayer *prev_layer = &frame_pyr->layers[level - 1];
    uint8_t *prev_buffer = prev_layer->buffer;
    int prev_stride = prev_layer->stride;

    PyramidLayer *this_layer = &frame_pyr->layers[level];
    uint8_t *this_buffer = this_layer->buffer;
    int this_width = this_layer->width;
    int this_height = this_layer->height;
    int this_stride = this_layer->stride;

    // The width and height of the previous layer that needs to be considered to
    // derive the current layer frame.
    const int input_layer_width = this_width << 1;
    const int input_layer_height = this_height << 1;

    // Compute the this pyramid level by downsampling the current level.
    //
    // We downsample by a factor of exactly 2, clipping the rightmost and
    // bottommost pixel off of the current level if needed. We do this for
    // two main reasons:
    //
    // 1) In the disflow code, when stepping from a higher pyramid level to a
    //    lower pyramid level, we need to not just interpolate the flow field
    //    but also to scale each flow vector by the upsampling ratio.
    //    So it is much more convenient if this ratio is simply 2.
    //
    // 2) Up/downsampling by a factor of 2 can be implemented much more
    //    efficiently than up/downsampling by a generic ratio.
    //    TODO(rachelbarker): Use optimized downsample-by-2 function

    // SIMD support has been added specifically for cases where the downsample
    // factor is exactly 2. In such instances, horizontal and vertical resizing
    // is performed utilizing the down2_symeven() function, which considers the
    // even dimensions of the input layer.
    if (should_resize_by_half(input_layer_height, input_layer_width,
                              this_height, this_width)) {
      assert(input_layer_height % 2 == 0 && input_layer_width % 2 == 0 &&
             "Input width or height cannot be odd.");
      mem_status = av1_resize_plane_to_half(
          prev_buffer, input_layer_height, input_layer_width, prev_stride,
          this_buffer, this_height, this_width, this_stride);
    } else {
      mem_status = av1_resize_plane(prev_buffer, input_layer_height,
                                    input_layer_width, prev_stride, this_buffer,
                                    this_height, this_width, this_stride);
    }

    // Terminate early in cases of memory allocation failure.
    if (!mem_status) {
      frame_pyr->filled_levels = n_levels;
      return -1;
    }

    fill_border(this_buffer, this_width, this_height, this_stride);
  }

  frame_pyr->filled_levels = n_levels;
  return n_levels;
}